

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsModule.cpp
# Opt level: O0

bool __thiscall
Js::AsmJsModuleCompiler::SetupLocalVariables(AsmJsModuleCompiler *this,AsmJsFunc *func)

{
  code *pcVar1;
  AsmJsVar *pAVar2;
  BOOLEAN BVar3;
  Which WVar4;
  uint uVar5;
  BVIndex BVar6;
  RegSlot RVar7;
  int iVar8;
  ParseNodeVar *pPVar9;
  IdentPtr pIVar10;
  PropertyName pIVar11;
  ParseNodeInt *pPVar12;
  ParseNodeFloat *pPVar13;
  undefined4 *puVar14;
  double *pdVar15;
  ParseNodeCall *pPVar16;
  ParseNode *pPVar17;
  bool bVar18;
  float val;
  double dVar19;
  float fVal;
  int iVal;
  AsmJsMathConst *definition_1;
  AsmJsType local_c0;
  AsmJsVarType local_bc;
  AsmJsVarType local_bb;
  AsmJsVarType local_ba;
  AsmJsVarType local_b9;
  AsmJsVar *local_b8;
  AsmJsVar *definition;
  AsmJsVar *pAStack_a8;
  RegSlot loc;
  AsmJsVar *var;
  AsmJsFunctionDeclaration *funcDecl;
  AsmJsSymbol *pAStack_90;
  bool isFroundInit;
  AsmJsSymbol *declSym;
  ParseNode *pnodeInit;
  ParseNode *local_78;
  ParseNode *decl;
  ParseNode *local_60;
  ParseNode *varNode;
  BVSparse<Memory::ArenaAllocator> initializerBV;
  MathBuiltin mathBuiltin;
  ParseNodePtr pnode;
  AsmJsFunc *func_local;
  AsmJsModuleCompiler *this_local;
  
  mathBuiltin.u.func = (AsmJsMathFunction *)AsmJsFunc::GetBodyNode(func);
  MathBuiltin::MathBuiltin((MathBuiltin *)&initializerBV.lastUsedNodePrevNextField);
  BVSparse<Memory::ArenaAllocator>::BVSparse
            ((BVSparse<Memory::ArenaAllocator> *)&varNode,&this->mAllocator);
  for (; *(char *)mathBuiltin.u.cst == 'P';
      mathBuiltin.u.cst = (double *)ParserWrapper::GetBinaryRight(mathBuiltin.u.cst)) {
    local_60 = ParserWrapper::GetBinaryLeft((ParseNode *)mathBuiltin.u.func);
    while( true ) {
      bVar18 = false;
      if (local_60 != (ParseNode *)0x0) {
        bVar18 = local_60->nop != knopEndCode;
      }
      if (!bVar18) break;
      if (local_60->nop == knopList) {
        local_78 = ParserWrapper::GetBinaryLeft(local_60);
        local_60 = ParserWrapper::GetBinaryRight(local_60);
      }
      else {
        local_78 = local_60;
        local_60 = (ParseNode *)0x0;
      }
      if (local_78->nop != knopVarDecl) {
        this_local._7_1_ = true;
        goto LAB_00d7e221;
      }
      pPVar9 = ParseNode::AsParseNodeVar(local_78);
      declSym = (AsmJsSymbol *)pPVar9->pnodeInit;
      pAStack_90 = (AsmJsSymbol *)0x0;
      funcDecl._7_1_ = 0;
      if (declSym == (AsmJsSymbol *)0x0) {
        this_local._7_1_ =
             Fail(this,local_78,
                  L"The righthand side of a var declaration missing an initialization (empty)");
        goto LAB_00d7e221;
      }
      if (*(OpCode *)&declSym->_vptr_AsmJsSymbol == knopName) {
        pIVar10 = ParseNode::name((ParseNode *)declSym);
        pAStack_90 = LookupIdentifier(this,pIVar10,func,(Source *)0x0);
        bVar18 = AsmJsVar::Is(pAStack_90);
        if (((!bVar18) && (bVar18 = AsmJsMathConst::Is(pAStack_90), !bVar18)) ||
           (uVar5 = (*pAStack_90->_vptr_AsmJsSymbol[1])(), (uVar5 & 1) != 0)) {
          this_local._7_1_ = Fail(this,local_78,L"Var declaration with non-constant");
          goto LAB_00d7e221;
        }
      }
      else {
        if (*(OpCode *)&declSym->_vptr_AsmJsSymbol == knopCall) {
          pPVar16 = ParseNode::AsParseNodeCall((ParseNode *)declSym);
          if (pPVar16->pnodeTarget->nop == knopName) {
            pPVar16 = ParseNode::AsParseNodeCall((ParseNode *)declSym);
            pIVar10 = ParseNode::name(pPVar16->pnodeTarget);
            var = (AsmJsVar *)LookupFunction(this,pIVar10);
            if ((AsmJsFunctionDeclaration *)var == (AsmJsFunctionDeclaration *)0x0) {
              this_local._7_1_ = Fail(this,(ParseNode *)declSym,L"Cannot resolve function name");
            }
            else {
              bVar18 = AsmJsMathFunction::Is((AsmJsSymbol *)var);
              if (bVar18) {
                bVar18 = AsmJsMathFunction::IsFround((AsmJsFunctionDeclaration *)var);
                if (bVar18) {
                  pPVar16 = ParseNode::AsParseNodeCall((ParseNode *)declSym);
                  bVar18 = ParserWrapper::IsFroundNumericLiteral(pPVar16->pnodeArgs);
                  if (bVar18) {
                    funcDecl._7_1_ = 1;
                    goto LAB_00d7d395;
                  }
                }
                this_local._7_1_ =
                     Fail(this,local_78,
                          L"Var declaration with something else than a literal value|fround call");
              }
              else {
                this_local._7_1_ = Fail(this,local_60,L"Unknown function call on var declaration");
              }
            }
          }
          else {
            this_local._7_1_ =
                 Fail(this,local_78,
                      L"Var declaration with something else than a literal value|fround call");
          }
          goto LAB_00d7e221;
        }
        if ((*(OpCode *)&declSym->_vptr_AsmJsSymbol != knopInt) &&
           (*(OpCode *)&declSym->_vptr_AsmJsSymbol != knopFlt)) {
          this_local._7_1_ =
               Fail(this,local_78,
                    L"Var declaration with something else than a literal value|fround call");
          goto LAB_00d7e221;
        }
      }
LAB_00d7d395:
      pPVar17 = local_78;
      pIVar10 = ParseNode::name(local_78);
      bVar18 = AsmJSCompiler::CheckIdentifier(this,pPVar17,pIVar10);
      if (!bVar18) {
        this_local._7_1_ = false;
        goto LAB_00d7e221;
      }
      pIVar10 = ParseNode::name(local_78);
      pAStack_a8 = (AsmJsVar *)AsmJsFunc::DefineVar(func,pIVar10,false,true);
      if (pAStack_a8 == (AsmJsVar *)0x0) {
        this_local._7_1_ = Fail(this,local_78,L"Failed to define var");
        goto LAB_00d7e221;
      }
      pIVar11 = AsmJsSymbol::GetName((AsmJsSymbol *)pAStack_a8);
      BVar6 = Ident::GetPropertyId(pIVar11);
      BVar3 = BVSparse<Memory::ArenaAllocator>::Test
                        ((BVSparse<Memory::ArenaAllocator> *)&varNode,BVar6);
      pAVar2 = pAStack_a8;
      if (BVar3 != '\0') {
        this_local._7_1_ =
             Fail(this,local_78,L"Cannot declare a var after using it in an initializer");
        goto LAB_00d7e221;
      }
      definition._4_4_ = 0xffffffff;
      if (*(char *)&declSym->_vptr_AsmJsSymbol == '\x02') {
        AsmJsVarType::AsmJsVarType((AsmJsVarType *)((long)&definition + 3),Int);
        AsmJsVarBase::SetVarType
                  (&pAVar2->super_AsmJsVarBase,(AsmJsVarType *)((long)&definition + 3));
        pAVar2 = pAStack_a8;
        RVar7 = AsmJsFunc::AcquireRegister<int>(func);
        AsmJsVarBase::SetLocation(&pAVar2->super_AsmJsVarBase,RVar7);
        pAVar2 = pAStack_a8;
        pPVar12 = ParseNode::AsParseNodeInt((ParseNode *)declSym);
        AsmJsVar::SetConstInitialiser(pAVar2,pPVar12->lw);
        pPVar12 = ParseNode::AsParseNodeInt((ParseNode *)declSym);
        definition._4_4_ = AsmJsFunc::GetConstRegister<int>(func,pPVar12->lw);
      }
      else {
        bVar18 = ParserWrapper::IsMinInt((ParseNode *)declSym);
        pAVar2 = pAStack_a8;
        if (bVar18) {
          AsmJsVarType::AsmJsVarType((AsmJsVarType *)((long)&definition + 2),Int);
          AsmJsVarBase::SetVarType
                    (&pAVar2->super_AsmJsVarBase,(AsmJsVarType *)((long)&definition + 2));
          pAVar2 = pAStack_a8;
          RVar7 = AsmJsFunc::AcquireRegister<int>(func);
          AsmJsVarBase::SetLocation(&pAVar2->super_AsmJsVarBase,RVar7);
          AsmJsVar::SetConstInitialiser(pAStack_a8,-0x80000000);
          definition._4_4_ = AsmJsFunc::GetConstRegister<int>(func,-0x80000000);
        }
        else {
          bVar18 = ParserWrapper::IsUnsigned((ParseNode *)declSym);
          pAVar2 = pAStack_a8;
          if (bVar18) {
            AsmJsVarType::AsmJsVarType((AsmJsVarType *)((long)&definition + 1),Int);
            AsmJsVarBase::SetVarType
                      (&pAVar2->super_AsmJsVarBase,(AsmJsVarType *)((long)&definition + 1));
            pAVar2 = pAStack_a8;
            RVar7 = AsmJsFunc::AcquireRegister<int>(func);
            AsmJsVarBase::SetLocation(&pAVar2->super_AsmJsVarBase,RVar7);
            pAVar2 = pAStack_a8;
            pPVar13 = ParseNode::AsParseNodeFloat((ParseNode *)declSym);
            AsmJsVar::SetConstInitialiser(pAVar2,(int)(long)pPVar13->dbl);
            pPVar13 = ParseNode::AsParseNodeFloat((ParseNode *)declSym);
            definition._4_4_ = AsmJsFunc::GetConstRegister<int>(func,(int)(long)pPVar13->dbl);
          }
          else if (*(char *)&declSym->_vptr_AsmJsSymbol == '\x05') {
            pPVar13 = ParseNode::AsParseNodeFloat((ParseNode *)declSym);
            pAVar2 = pAStack_a8;
            if ((pPVar13->field_0x18 & 1) != 0) {
              this_local._7_1_ =
                   Fail(this,local_78,
                        L"Var declaration with integer literal outside range [-2^31, 2^32)");
              goto LAB_00d7e221;
            }
            AsmJsVarType::AsmJsVarType((AsmJsVarType *)&definition,Double);
            AsmJsVarBase::SetVarType(&pAVar2->super_AsmJsVarBase,(AsmJsVarType *)&definition);
            pAVar2 = pAStack_a8;
            RVar7 = AsmJsFunc::AcquireRegister<double>(func);
            AsmJsVarBase::SetLocation(&pAVar2->super_AsmJsVarBase,RVar7);
            pPVar13 = ParseNode::AsParseNodeFloat((ParseNode *)declSym);
            definition._4_4_ = AsmJsFunc::GetConstRegister<double>(func,pPVar13->dbl);
            pAVar2 = pAStack_a8;
            pPVar13 = ParseNode::AsParseNodeFloat((ParseNode *)declSym);
            AsmJsVar::SetConstInitialiser(pAVar2,pPVar13->dbl);
          }
          else if (*(char *)&declSym->_vptr_AsmJsSymbol == '\x01') {
            bVar18 = AsmJsVar::Is(pAStack_90);
            if (bVar18) {
              local_b8 = AsmJsVar::FromSymbol(pAStack_90);
              pIVar11 = AsmJsSymbol::GetName((AsmJsSymbol *)local_b8);
              BVar6 = Ident::GetPropertyId(pIVar11);
              BVSparse<Memory::ArenaAllocator>::Set
                        ((BVSparse<Memory::ArenaAllocator> *)&varNode,BVar6);
              local_b9 = AsmJsVarBase::GetVarType(&local_b8->super_AsmJsVarBase);
              WVar4 = AsmJsVarType::which(&local_b9);
              pAVar2 = pAStack_a8;
              if (WVar4 == Int) {
                AsmJsVarType::AsmJsVarType(&local_bc,Int);
                AsmJsVarBase::SetVarType(&pAVar2->super_AsmJsVarBase,&local_bc);
                pAVar2 = pAStack_a8;
                RVar7 = AsmJsFunc::AcquireRegister<int>(func);
                AsmJsVarBase::SetLocation(&pAVar2->super_AsmJsVarBase,RVar7);
                pAVar2 = pAStack_a8;
                iVar8 = AsmJsVar::GetIntInitialiser(local_b8);
                AsmJsVar::SetConstInitialiser(pAVar2,iVar8);
              }
              else if (WVar4 == Double) {
                AsmJsVarType::AsmJsVarType(&local_ba,Double);
                AsmJsVarBase::SetVarType(&pAVar2->super_AsmJsVarBase,&local_ba);
                pAVar2 = pAStack_a8;
                RVar7 = AsmJsFunc::AcquireRegister<double>(func);
                AsmJsVarBase::SetLocation(&pAVar2->super_AsmJsVarBase,RVar7);
                pAVar2 = pAStack_a8;
                dVar19 = AsmJsVar::GetDoubleInitialiser(local_b8);
                AsmJsVar::SetConstInitialiser(pAVar2,dVar19);
              }
              else if (WVar4 == Float) {
                AsmJsVarType::AsmJsVarType(&local_bb,Float);
                AsmJsVarBase::SetVarType(&pAVar2->super_AsmJsVarBase,&local_bb);
                pAVar2 = pAStack_a8;
                RVar7 = AsmJsFunc::AcquireRegister<float>(func);
                AsmJsVarBase::SetLocation(&pAVar2->super_AsmJsVarBase,RVar7);
                pAVar2 = pAStack_a8;
                val = AsmJsVar::GetFloatInitialiser(local_b8);
                AsmJsVar::SetConstInitialiser(pAVar2,val);
              }
              else {
                AssertCount = AssertCount + 1;
                Throw::LogAssert();
                puVar14 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                *puVar14 = 1;
                bVar18 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsModule.cpp"
                                             ,0x390,"((0))","(0)");
                if (!bVar18) {
                  pcVar1 = (code *)invalidInstructionException();
                  (*pcVar1)();
                }
                puVar14 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                *puVar14 = 0;
              }
            }
            else {
              local_c0.which_ = (**pAStack_90->_vptr_AsmJsSymbol)();
              AsmJsType::AsmJsType((AsmJsType *)((long)&definition_1 + 4),Double);
              bVar18 = AsmJsType::operator==(&local_c0,definition_1._4_4_);
              if (((bVar18 ^ 0xffU) & 1) != 0) {
                AssertCount = AssertCount + 1;
                Throw::LogAssert();
                puVar14 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                *puVar14 = 1;
                bVar18 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsModule.cpp"
                                             ,0x395,"(declSym->GetType() == AsmJsType::Double)",
                                             "declSym->GetType() == AsmJsType::Double");
                if (!bVar18) {
                  pcVar1 = (code *)invalidInstructionException();
                  (*pcVar1)();
                }
                puVar14 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                *puVar14 = 0;
              }
              _iVal = AsmJsMathConst::FromSymbol(pAStack_90);
              pAVar2 = pAStack_a8;
              AsmJsVarType::AsmJsVarType((AsmJsVarType *)((long)&fVal + 3),Double);
              AsmJsVarBase::SetVarType
                        (&pAVar2->super_AsmJsVarBase,(AsmJsVarType *)((long)&fVal + 3));
              pAVar2 = pAStack_a8;
              RVar7 = AsmJsFunc::AcquireRegister<double>(func);
              AsmJsVarBase::SetLocation(&pAVar2->super_AsmJsVarBase,RVar7);
              pAVar2 = pAStack_a8;
              pdVar15 = AsmJsMathConst::GetVal(_iVal);
              AsmJsVar::SetConstInitialiser(pAVar2,*pdVar15);
            }
          }
          else if (*(char *)&declSym->_vptr_AsmJsSymbol == '/') {
            if ((funcDecl._7_1_ & 1) == 0) {
              AssertCount = AssertCount + 1;
              Throw::LogAssert();
              puVar14 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar14 = 1;
              bVar18 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsModule.cpp"
                                           ,0x3ba,"((0))","UNREACHED");
              if (!bVar18) {
                pcVar1 = (code *)invalidInstructionException();
                (*pcVar1)();
              }
              puVar14 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar14 = 0;
            }
            else {
              AsmJsVarType::AsmJsVarType((AsmJsVarType *)((long)&fVal + 2),Float);
              AsmJsVarBase::SetVarType
                        (&pAVar2->super_AsmJsVarBase,(AsmJsVarType *)((long)&fVal + 2));
              pAVar2 = pAStack_a8;
              RVar7 = AsmJsFunc::AcquireRegister<float>(func);
              AsmJsVarBase::SetLocation(&pAVar2->super_AsmJsVarBase,RVar7);
              pPVar16 = ParseNode::AsParseNodeCall((ParseNode *)declSym);
              if (pPVar16->pnodeArgs->nop == knopInt) {
                pPVar16 = ParseNode::AsParseNodeCall((ParseNode *)declSym);
                pPVar12 = ParseNode::AsParseNodeInt(pPVar16->pnodeArgs);
                iVar8 = pPVar12->lw;
                AsmJsVar::SetConstInitialiser(pAStack_a8,(float)iVar8);
                definition._4_4_ = AsmJsFunc::GetConstRegister<float>(func,(float)iVar8);
              }
              else {
                pPVar16 = ParseNode::AsParseNodeCall((ParseNode *)declSym);
                bVar18 = ParserWrapper::IsNegativeZero(pPVar16->pnodeArgs);
                if (bVar18) {
                  AsmJsVar::SetConstInitialiser(pAStack_a8,-0.0);
                  definition._4_4_ = AsmJsFunc::GetConstRegister<float>(func,-0.0);
                }
                else {
                  pPVar16 = ParseNode::AsParseNodeCall((ParseNode *)declSym);
                  if (pPVar16->pnodeArgs->nop != knopFlt) {
                    AssertCount = AssertCount + 1;
                    Throw::LogAssert();
                    puVar14 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                    *puVar14 = 1;
                    bVar18 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsModule.cpp"
                                                 ,0x3b2,
                                                 "(pnodeInit->AsParseNodeCall()->pnodeArgs->nop == knopFlt)"
                                                 ,
                                                 "pnodeInit->AsParseNodeCall()->pnodeArgs->nop == knopFlt"
                                                );
                    if (!bVar18) {
                      pcVar1 = (code *)invalidInstructionException();
                      (*pcVar1)();
                    }
                    puVar14 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                    *puVar14 = 0;
                  }
                  pPVar16 = ParseNode::AsParseNodeCall((ParseNode *)declSym);
                  pPVar13 = ParseNode::AsParseNodeFloat(pPVar16->pnodeArgs);
                  dVar19 = pPVar13->dbl;
                  AsmJsVar::SetConstInitialiser(pAStack_a8,(float)dVar19);
                  definition._4_4_ = AsmJsFunc::GetConstRegister<float>(func,(float)dVar19);
                }
              }
            }
          }
        }
      }
      if ((definition._4_4_ == 0xffffffff) && (*(char *)&declSym->_vptr_AsmJsSymbol != '\x01')) {
        this_local._7_1_ = Fail(this,local_78,L"Cannot find Register constant for var");
        goto LAB_00d7e221;
      }
    }
    pPVar17 = ParserWrapper::GetBinaryRight((ParseNode *)mathBuiltin.u.func);
    if (pPVar17->nop == knopEndCode) break;
  }
  this_local._7_1_ = true;
LAB_00d7e221:
  pnodeInit._4_4_ = 1;
  BVSparse<Memory::ArenaAllocator>::~BVSparse((BVSparse<Memory::ArenaAllocator> *)&varNode);
  return this_local._7_1_;
}

Assistant:

bool AsmJsModuleCompiler::SetupLocalVariables(AsmJsFunc * func)
    {
        ParseNodePtr pnode = func->GetBodyNode();
        MathBuiltin mathBuiltin;
        // define all variables
        BVSparse<ArenaAllocator> initializerBV(&mAllocator);
        while (pnode->nop == knopList)
        {
            ParseNode * varNode = ParserWrapper::GetBinaryLeft(pnode);
            while (varNode && varNode->nop != knopEndCode)
            {
                ParseNode * decl;
                if (varNode->nop == knopList)
                {
                    decl = ParserWrapper::GetBinaryLeft(varNode);
                    varNode = ParserWrapper::GetBinaryRight(varNode);
                }
                else
                {
                    decl = varNode;
                    varNode = nullptr;
                }
                // if we have hit a non-declaration, we are done processing the function header
                if (decl->nop != knopVarDecl)
                {
                    return true;
                }
                ParseNode* pnodeInit = decl->AsParseNodeVar()->pnodeInit;
                AsmJsSymbol * declSym = nullptr;

                bool isFroundInit = false;
                if (!pnodeInit)
                {
                    return Fail(decl, _u("The righthand side of a var declaration missing an initialization (empty)"));
                }

                if (pnodeInit->nop == knopName)
                {
                    declSym = LookupIdentifier(pnodeInit->name(), func);
                    if ((!AsmJsVar::Is(declSym) && !AsmJsMathConst::Is(declSym)) || declSym->isMutable())
                    {
                        return Fail(decl, _u("Var declaration with non-constant"));
                    }
                }
                else if (pnodeInit->nop == knopCall)
                {
                    if (pnodeInit->AsParseNodeCall()->pnodeTarget->nop != knopName)
                    {
                        return Fail(decl, _u("Var declaration with something else than a literal value|fround call"));
                    }
                    AsmJsFunctionDeclaration* funcDecl = this->LookupFunction(pnodeInit->AsParseNodeCall()->pnodeTarget->name());

                    if (!funcDecl)
                        return Fail(pnodeInit, _u("Cannot resolve function name"));

                    if (AsmJsMathFunction::Is(funcDecl))
                    {
                        if (!AsmJsMathFunction::IsFround(funcDecl) || !ParserWrapper::IsFroundNumericLiteral(pnodeInit->AsParseNodeCall()->pnodeArgs))
                        {
                            return Fail(decl, _u("Var declaration with something else than a literal value|fround call"));
                        }
                        isFroundInit = true;
                    }
                    else
                    {
                        return Fail(varNode, _u("Unknown function call on var declaration"));
                    }
                }
                else if (pnodeInit->nop != knopInt && pnodeInit->nop != knopFlt)
                {
                    return Fail(decl, _u("Var declaration with something else than a literal value|fround call"));
                }
                if (!AsmJSCompiler::CheckIdentifier(*this, decl, decl->name()))
                {
                    // CheckIdentifier will print failure message
                    return false;
                }

                AsmJsVar* var = (AsmJsVar*)func->DefineVar(decl->name(), false);
                if (!var)
                {
                    return Fail(decl, _u("Failed to define var"));
                }
                // If we are declaring a var that we previously used in an initializer, that value will be undefined
                // so we need to throw an error.
                if (initializerBV.Test(var->GetName()->GetPropertyId()))
                {
                    return Fail(decl, _u("Cannot declare a var after using it in an initializer"));
                }
                RegSlot loc = Constants::NoRegister;
                if (pnodeInit->nop == knopInt)
                {
                    var->SetVarType(AsmJsVarType::Int);
                    var->SetLocation(func->AcquireRegister<int>());
                    var->SetConstInitialiser(pnodeInit->AsParseNodeInt()->lw);
                    loc = func->GetConstRegister<int>(pnodeInit->AsParseNodeInt()->lw);
                }
                else if (ParserWrapper::IsMinInt(pnodeInit))
                {
                    var->SetVarType(AsmJsVarType::Int);
                    var->SetLocation(func->AcquireRegister<int>());
                    var->SetConstInitialiser(INT_MIN);
                    loc = func->GetConstRegister<int>(INT_MIN);
                }
                else if (ParserWrapper::IsUnsigned(pnodeInit))
                {
                    var->SetVarType(AsmJsVarType::Int);
                    var->SetLocation(func->AcquireRegister<int>());
                    var->SetConstInitialiser((int)((uint32)pnodeInit->AsParseNodeFloat()->dbl));
                    loc = func->GetConstRegister<int>((uint32)pnodeInit->AsParseNodeFloat()->dbl);
                }
                else if (pnodeInit->nop == knopFlt)
                {
                    if (pnodeInit->AsParseNodeFloat()->maybeInt)
                    {
                        return Fail(decl, _u("Var declaration with integer literal outside range [-2^31, 2^32)"));
                    }
                    var->SetVarType(AsmJsVarType::Double);
                    var->SetLocation(func->AcquireRegister<double>());
                    loc = func->GetConstRegister<double>(pnodeInit->AsParseNodeFloat()->dbl);
                    var->SetConstInitialiser(pnodeInit->AsParseNodeFloat()->dbl);
                }
                else if (pnodeInit->nop == knopName)
                {
                    if (AsmJsVar::Is(declSym))
                    {
                        AsmJsVar * definition = AsmJsVar::FromSymbol(declSym);
                        initializerBV.Set(definition->GetName()->GetPropertyId());
                        switch (definition->GetVarType().which())
                        {
                        case AsmJsVarType::Double:
                            var->SetVarType(AsmJsVarType::Double);
                            var->SetLocation(func->AcquireRegister<double>());
                            var->SetConstInitialiser(definition->GetDoubleInitialiser());
                            break;

                        case AsmJsVarType::Float:
                            var->SetVarType(AsmJsVarType::Float);
                            var->SetLocation(func->AcquireRegister<float>());
                            var->SetConstInitialiser(definition->GetFloatInitialiser());
                            break;

                        case AsmJsVarType::Int:
                            var->SetVarType(AsmJsVarType::Int);
                            var->SetLocation(func->AcquireRegister<int>());
                            var->SetConstInitialiser(definition->GetIntInitialiser());
                            break;

                        default:
                            Assume(UNREACHED);
                        }
                    }
                    else
                    {
                        Assert(declSym->GetType() == AsmJsType::Double);

                        AsmJsMathConst * definition = AsmJsMathConst::FromSymbol(declSym);

                        var->SetVarType(AsmJsVarType::Double);
                        var->SetLocation(func->AcquireRegister<double>());
                        var->SetConstInitialiser(*definition->GetVal());
                    }
                }
                else if (pnodeInit->nop == knopCall)
                {
                    if (isFroundInit)
                    {
                        var->SetVarType(AsmJsVarType::Float);
                        var->SetLocation(func->AcquireRegister<float>());
                        if (pnodeInit->AsParseNodeCall()->pnodeArgs->nop == knopInt)
                        {
                            int iVal = pnodeInit->AsParseNodeCall()->pnodeArgs->AsParseNodeInt()->lw;
                            var->SetConstInitialiser((float)iVal);
                            loc = func->GetConstRegister<float>((float)iVal);
                        }
                        else if (ParserWrapper::IsNegativeZero(pnodeInit->AsParseNodeCall()->pnodeArgs))
                        {
                            var->SetConstInitialiser(-0.0f);
                            loc = func->GetConstRegister<float>(-0.0f);
                        }
                        else
                        {
                            // note: fround((-)NumericLiteral) is explicitly allowed for any range, so we do not need to check for maybeInt
                            Assert(pnodeInit->AsParseNodeCall()->pnodeArgs->nop == knopFlt);
                            float fVal = (float)pnodeInit->AsParseNodeCall()->pnodeArgs->AsParseNodeFloat()->dbl;
                            var->SetConstInitialiser((float)fVal);
                            loc = func->GetConstRegister<float>(fVal);
                        }
                    }
                    else
                    {
                        Assert(UNREACHED);
                    }
                }

                if (loc == Constants::NoRegister && pnodeInit->nop != knopName)
                {
                    return Fail(decl, _u("Cannot find Register constant for var"));
                }
            }

            if (ParserWrapper::GetBinaryRight(pnode)->nop == knopEndCode)
            {
                break;
            }
            pnode = ParserWrapper::GetBinaryRight(pnode);
        }
        return true;
    }